

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

int32_t duckdb::TimeToStringCast::FormatMicros(int32_t microseconds,char *micro_buffer)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = NumericHelper::FormatUnsigned<int>(microseconds,micro_buffer + 6);
  if (micro_buffer <= pcVar1 && (long)pcVar1 - (long)micro_buffer != 0) {
    switchD_005681f0::default(micro_buffer,0x30,(long)pcVar1 - (long)micro_buffer);
  }
  pcVar1 = micro_buffer + 5;
  lVar2 = 0;
  do {
    if (*pcVar1 != '0') goto LAB_0028effc;
    lVar2 = lVar2 + 1;
    pcVar1 = pcVar1 + -1;
  } while (lVar2 != 5);
  lVar2 = 5;
LAB_0028effc:
  return (int32_t)lVar2;
}

Assistant:

static int32_t FormatMicros(int32_t microseconds, char micro_buffer[]) {
		char *endptr = micro_buffer + 6;
		endptr = NumericHelper::FormatUnsigned<int32_t>(microseconds, endptr);
		while (endptr > micro_buffer) {
			*--endptr = '0';
		}
		idx_t trailing_zeros = 0;
		for (idx_t i = 5; i > 0; i--) {
			if (micro_buffer[i] != '0') {
				break;
			}
			trailing_zeros++;
		}
		return UnsafeNumericCast<int32_t>(trailing_zeros);
	}